

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::num_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::int_writer<char,_fmt::v5::basic_format_specs<char>_>::num_writer>
             *this,counting_iterator<char> *it)

{
  counting_iterator<char> __first;
  size_t sVar1;
  size_t *in_RSI;
  long in_RDI;
  type tVar2;
  counting_iterator<char> cVar3;
  counting_iterator<char> *in_stack_00000008;
  num_writer *in_stack_00000010;
  char *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff91;
  size_t in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb1;
  size_t in_stack_ffffffffffffffb8;
  char in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc1;
  
  sVar1 = basic_string_view<char>::size((basic_string_view<char> *)(in_RDI + 8));
  if (sVar1 != 0) {
    basic_string_view<char>::begin((basic_string_view<char> *)(in_RDI + 8));
    basic_string_view<char>::end((basic_string_view<char> *)(in_RDI + 8));
    cVar3._8_8_ = in_stack_ffffffffffffffa0;
    cVar3.count_ = in_stack_ffffffffffffff98;
    tVar2 = internal::copy_str<char,char_const*,fmt::v5::internal::counting_iterator<char>>
                      ((char *)CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88,cVar3);
    in_stack_ffffffffffffffb8 = tVar2.count_;
    in_stack_ffffffffffffffc0 = tVar2.blackhole_;
    *in_RSI = in_stack_ffffffffffffffb8;
    *(char *)(in_RSI + 1) = in_stack_ffffffffffffffc0;
  }
  __first.blackhole_ = in_stack_ffffffffffffffc0;
  __first.count_ = in_stack_ffffffffffffffb8;
  __first._9_7_ = in_stack_ffffffffffffffc1;
  cVar3 = std::fill_n<fmt::v5::internal::counting_iterator<char>,unsigned_long,char>
                    (__first,CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
  *in_RSI = cVar3.count_;
  *(char *)(in_RSI + 1) = cVar3.blackhole_;
  int_writer<char,fmt::v5::basic_format_specs<char>>::num_writer::operator()
            (in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }